

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

cmCPackIFWRepository * __thiscall
cmCPackIFWGenerator::GetRepository(cmCPackIFWGenerator *this,string *repositoryName)

{
  RepositoriesMap *this_00;
  cmCPackIFWGenerator *pcVar1;
  cmCPackLog *this_01;
  bool bVar2;
  iterator iVar3;
  mapped_type *this_02;
  ostream *poVar4;
  RepositoriesVector *this_03;
  cmCPackIFWRepository *repository;
  char *local_1b8 [4];
  ostringstream cmCPackLog_msg;
  
  this_00 = &this->Repositories;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
          ::find(&this_00->_M_t,repositoryName);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->Repositories)._M_t._M_impl.super__Rb_tree_header)
  {
    this_02 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
              ::operator[](this_00,repositoryName);
    repository = this_02;
    std::__cxx11::string::_M_assign((string *)&this_02->Name);
    (this_02->super_cmCPackIFWCommon).Generator = this;
    bVar2 = cmCPackIFWRepository::ConfigureFromOptions(this_02);
    if (bVar2) {
      if (this_02->Update == None) {
        this_03 = &(this->Installer).RemoteRepositories;
      }
      else {
        this_03 = &(this->Repository).RepositoryUpdate;
      }
      std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::push_back
                (this_03,&repository);
    }
    else {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
      ::erase(&this_00->_M_t,repositoryName);
      repository = (cmCPackIFWRepository *)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Invalid repository \"");
      poVar4 = std::operator<<(poVar4,(string *)repositoryName);
      poVar4 = std::operator<<(poVar4,"\"");
      poVar4 = std::operator<<(poVar4," configuration. Repository will be skipped.");
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
        this_01 = (pcVar1->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(this_01,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                        ,0x22d,local_1b8[0]);
        std::__cxx11::string::~string((string *)local_1b8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    }
  }
  else {
    repository = (cmCPackIFWRepository *)(iVar3._M_node + 2);
  }
  return repository;
}

Assistant:

cmCPackIFWRepository* cmCPackIFWGenerator::GetRepository(
  const std::string& repositoryName)
{
  RepositoriesMap::iterator rit = this->Repositories.find(repositoryName);
  if (rit != this->Repositories.end()) {
    return &(rit->second);
  }

  cmCPackIFWRepository* repository = &this->Repositories[repositoryName];
  repository->Name = repositoryName;
  repository->Generator = this;
  if (repository->ConfigureFromOptions()) {
    if (repository->Update == cmCPackIFWRepository::None) {
      this->Installer.RemoteRepositories.push_back(repository);
    } else {
      this->Repository.RepositoryUpdate.push_back(repository);
    }
  } else {
    this->Repositories.erase(repositoryName);
    repository = CM_NULLPTR;
    cmCPackIFWLogger(WARNING, "Invalid repository \""
                       << repositoryName << "\""
                       << " configuration. Repository will be skipped."
                       << std::endl);
  }
  return repository;
}